

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_initialize_with_callbacks(ENetVersion version,ENetCallbacks *inits)

{
  ENetCallbacks *inits_local;
  ENetVersion version_local;
  
  if (version < 0x10300) {
    inits_local._4_4_ = -1;
  }
  else {
    if ((inits->malloc != (_func_void_ptr_size_t *)0x0) ||
       (inits->free != (_func_void_void_ptr *)0x0)) {
      if ((inits->malloc == (_func_void_ptr_size_t *)0x0) ||
         (inits->free == (_func_void_void_ptr *)0x0)) {
        return -1;
      }
      callbacks.malloc = inits->malloc;
      callbacks.free = inits->free;
    }
    if (inits->no_memory != (_func_void *)0x0) {
      callbacks.no_memory = inits->no_memory;
    }
    if ((inits->packet_create != (_func_ENetPacket_ptr_void_ptr_size_t_enet_uint32 *)0x0) ||
       (inits->packet_destroy != (_func_void_ENetPacket_ptr *)0x0)) {
      if ((inits->packet_create == (_func_ENetPacket_ptr_void_ptr_size_t_enet_uint32 *)0x0) ||
         (inits->packet_destroy == (_func_void_ENetPacket_ptr *)0x0)) {
        return -1;
      }
      callbacks.packet_create = inits->packet_create;
      callbacks.packet_destroy = inits->packet_destroy;
    }
    inits_local._4_4_ = enet_initialize();
  }
  return inits_local._4_4_;
}

Assistant:

int enet_initialize_with_callbacks(ENetVersion version, const ENetCallbacks *inits) {
        if (version < ENET_VERSION_CREATE(1, 3, 0)) {
            return -1;
        }

        if (inits->malloc != NULL || inits->free != NULL) {
            if (inits->malloc == NULL || inits->free == NULL) {
                return -1;
            }

            callbacks.malloc = inits->malloc;
            callbacks.free   = inits->free;
        }

        if (inits->no_memory != NULL) {
            callbacks.no_memory = inits->no_memory;
        }

        if (inits->packet_create != NULL || inits->packet_destroy != NULL) {
            if (inits->packet_create == NULL || inits->packet_destroy == NULL) {
                return -1;
            }

            callbacks.packet_create = inits->packet_create;
            callbacks.packet_destroy = inits->packet_destroy;
        }

        return enet_initialize();
    }